

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::optimizeStageIO::TIOTraverser::~TIOTraverser(TIOTraverser *this)

{
  void *in_RSI;
  TIOTraverser *this_local;
  
  ~TIOTraverser(this);
  TIntermTraverser::operator_delete((TIntermTraverser *)this,in_RSI);
  return;
}

Assistant:

TIOTraverser(TIntermediate& i, bool all, TIntermSequence& sequence, TStorageQualifier storage)
            : TLiveTraverser(i, all, true, false, false), sequence(sequence), storage(storage)
        {
        }